

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_object.c
# Opt level: O3

int json_object_int_inc(json_object *jso,int64_t val)

{
  json_object_to_json_string_fn *pjVar1;
  json_object_to_json_string_fn *pjVar2;
  
  if (jso == (json_object *)0x0) {
    return 0;
  }
  if (jso->o_type != json_type_int) {
    return 0;
  }
  if (jso[1].o_type == json_type_boolean) {
    if (val < 1) {
      pjVar2 = jso[1]._to_json_string;
      if (val < 0) {
        jso[1]._to_json_string = pjVar2 + val;
        if (pjVar2 < (json_object_to_json_string_fn *)-val) {
          jso[1].o_type = json_type_null;
          return 1;
        }
        return 1;
      }
    }
    else {
      pjVar2 = jso[1]._to_json_string;
      if (CARRY8(val,(ulong)pjVar2)) {
        jso[1]._to_json_string = (json_object_to_json_string_fn *)0xffffffffffffffff;
        return 1;
      }
    }
    pjVar2 = pjVar2 + val;
LAB_001059f5:
    jso[1]._to_json_string = pjVar2;
  }
  else {
    if (jso[1].o_type != json_type_null) {
      json_object_int_inc_cold_1();
    }
    pjVar2 = (json_object_to_json_string_fn *)0x8000000000000000;
    if (val < 1) {
      pjVar1 = jso[1]._to_json_string;
      if ((long)pjVar1 < -0x8000000000000000 - val && val != 0) goto LAB_001059f5;
    }
    else {
      pjVar1 = jso[1]._to_json_string;
      if ((long)(~val + 0x8000000000000000U) < (long)pjVar1) {
        jso[1]._to_json_string = pjVar1 + val;
        jso[1].o_type = json_type_boolean;
        return 1;
      }
    }
    jso[1]._to_json_string = pjVar1 + val;
  }
  return 1;
}

Assistant:

int json_object_int_inc(struct json_object *jso, int64_t val)
{
	struct json_object_int *jsoint;
	if (!jso || jso->o_type != json_type_int)
		return 0;
	jsoint = JC_INT(jso);
	switch (jsoint->cint_type)
	{
	case json_object_int_type_int64:
		if (val > 0 && jsoint->cint.c_int64 > INT64_MAX - val)
		{
			jsoint->cint.c_uint64 = (uint64_t)jsoint->cint.c_int64 + (uint64_t)val;
			jsoint->cint_type = json_object_int_type_uint64;
		}
		else if (val < 0 && jsoint->cint.c_int64 < INT64_MIN - val)
		{
			jsoint->cint.c_int64 = INT64_MIN;
		}
		else
		{
			jsoint->cint.c_int64 += val;
		}
		return 1;
	case json_object_int_type_uint64:
		if (val > 0 && jsoint->cint.c_uint64 > UINT64_MAX - (uint64_t)val)
		{
			jsoint->cint.c_uint64 = UINT64_MAX;
		}
		else if (val < 0 && jsoint->cint.c_uint64 < (uint64_t)(-val))
		{
			jsoint->cint.c_int64 = (int64_t)jsoint->cint.c_uint64 + val;
			jsoint->cint_type = json_object_int_type_int64;
		}
		else if (val < 0 && jsoint->cint.c_uint64 >= (uint64_t)(-val))
		{
			jsoint->cint.c_uint64 -= (uint64_t)(-val);
		}
		else
		{
			jsoint->cint.c_uint64 += val;
		}
		return 1;
	default: json_abort("invalid cint_type");
	}
}